

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O0

DynamicEntryList * __thiscall
cmELFInternalImpl<cmELFTypes32>::GetDynamicEntries
          (DynamicEntryList *__return_storage_ptr__,cmELFInternalImpl<cmELFTypes32> *this)

{
  bool bVar1;
  size_type __n;
  pair<unsigned_long,_unsigned_long> local_68;
  pair<long,_unsigned_long> local_58;
  reference local_48;
  ELF_Dyn *dyn;
  __normal_iterator<Elf32_Dyn_*,_std::vector<Elf32_Dyn,_std::allocator<Elf32_Dyn>_>_> local_38;
  iterator di;
  cmELFInternalImpl<cmELFTypes32> *this_local;
  DynamicEntryList *result;
  
  std::vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>::
  vector(__return_storage_ptr__);
  bVar1 = LoadDynamicSection(this);
  if (bVar1) {
    __n = std::vector<Elf32_Dyn,_std::allocator<Elf32_Dyn>_>::size(&this->DynamicSectionEntries);
    std::vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>::
    reserve(__return_storage_ptr__,__n);
    local_38._M_current =
         (anon_struct_8_2_e1977730 *)
         std::vector<Elf32_Dyn,_std::allocator<Elf32_Dyn>_>::begin(&this->DynamicSectionEntries);
    while( true ) {
      dyn = (ELF_Dyn *)
            std::vector<Elf32_Dyn,_std::allocator<Elf32_Dyn>_>::end(&this->DynamicSectionEntries);
      bVar1 = __gnu_cxx::operator!=
                        (&local_38,
                         (__normal_iterator<Elf32_Dyn_*,_std::vector<Elf32_Dyn,_std::allocator<Elf32_Dyn>_>_>
                          *)&dyn);
      if (!bVar1) break;
      local_48 = __gnu_cxx::
                 __normal_iterator<Elf32_Dyn_*,_std::vector<Elf32_Dyn,_std::allocator<Elf32_Dyn>_>_>
                 ::operator*(&local_38);
      std::pair<unsigned_long,_unsigned_long>::pair<int_&,_unsigned_int_&,_true>
                (&local_68,&local_48->d_tag,&(local_48->d_un).d_val);
      std::pair<long,_unsigned_long>::pair<unsigned_long,_unsigned_long,_true>(&local_58,&local_68);
      std::vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
      ::push_back(__return_storage_ptr__,&local_58);
      __gnu_cxx::__normal_iterator<Elf32_Dyn_*,_std::vector<Elf32_Dyn,_std::allocator<Elf32_Dyn>_>_>
      ::operator++(&local_38);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

cmELF::DynamicEntryList cmELFInternalImpl<Types>::GetDynamicEntries()
{
  cmELF::DynamicEntryList result;

  // Ensure entries have been read from file
  if (!this->LoadDynamicSection()) {
    return result;
  }

  // Copy into public array
  result.reserve(this->DynamicSectionEntries.size());
  for (typename std::vector<ELF_Dyn>::iterator di =
         this->DynamicSectionEntries.begin();
       di != this->DynamicSectionEntries.end(); ++di) {
    ELF_Dyn& dyn = *di;
    result.push_back(
      std::pair<unsigned long, unsigned long>(dyn.d_tag, dyn.d_un.d_val));
  }

  return result;
}